

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float32 float32_exp2_x86_64(float32 a,float_status *status)

{
  float32 fVar1;
  float32 fVar2;
  float64 fVar3;
  float64 b;
  float64 b_00;
  uint uVar4;
  long lVar5;
  float64 a_00;
  
  fVar1 = float32_squash_input_denormal_x86_64(a,status);
  uVar4 = fVar1 >> 0x17 & 0xff;
  if (uVar4 == 0xff) {
    if ((fVar1 & 0x7fffff) != 0) {
      fVar1 = propagateFloat32NaN(fVar1,0,status);
      return fVar1;
    }
    fVar2 = 0;
    if (0 < (int)fVar1) {
      fVar2 = fVar1;
    }
  }
  else {
    if (uVar4 != 0 || (fVar1 & 0x7fffff) != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
      fVar3 = float32_to_float64_x86_64(fVar1,status);
      b = float64_mul_x86_64(fVar3,0x3fe62e42fefa39ef,status);
      a_00 = 0x3ff0000000000000;
      fVar3 = b;
      for (lVar5 = 0; lVar5 != 0x78; lVar5 = lVar5 + 8) {
        b_00 = float64_mul_x86_64(fVar3,*(float64 *)((long)float32_exp2_coefficients + lVar5),status
                                 );
        a_00 = float64_add_x86_64(a_00,b_00,status);
        fVar3 = float64_mul_x86_64(fVar3,b,status);
      }
      fVar1 = float64_to_float32_x86_64(a_00,status);
      return fVar1;
    }
    fVar2 = 0x3f800000;
  }
  return fVar2;
}

Assistant:

float32 float32_exp2(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;
    float64 r, x, xn;
    int i;
    a = float32_squash_input_denormal(a, status);

    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );

    if ( aExp == 0xFF) {
        if (aSig) {
            return propagateFloat32NaN(a, float32_zero, status);
        }
        return (aSign) ? float32_zero : a;
    }
    if (aExp == 0) {
        if (aSig == 0) return float32_one;
    }

    float_raise(float_flag_inexact, status);

    /* ******************************* */
    /* using float64 for approximation */
    /* ******************************* */
    x = float32_to_float64(a, status);
    x = float64_mul(x, float64_ln2, status);

    xn = x;
    r = float64_one;
    for (i = 0 ; i < 15 ; i++) {
        float64 f;

        f = float64_mul(xn, float32_exp2_coefficients[i], status);
        r = float64_add(r, f, status);

        xn = float64_mul(xn, x, status);
    }

    return float64_to_float32(r, status);
}